

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

NodeBase ** __thiscall
google::protobuf::internal::UntypedMapBase::CreateEmptyTable(UntypedMapBase *this,map_index_t n)

{
  ulong num_elements;
  Nonnull<const_char_*> failure_msg;
  NodeBase **__s;
  int line;
  uint local_24;
  LogMessageFatal local_20;
  
  num_elements = (ulong)n;
  local_24 = 2;
  local_20.super_LogMessage.errno_saver_.saved_errno_ = n;
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl<unsigned_int,unsigned_int>
                          ((uint *)&local_20,&local_24,"n >= kMinTableSize");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_20.super_LogMessage.errno_saver_.saved_errno_ = n - 1 & n;
    local_24 = 0;
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_int>
                            ((uint *)&local_20,&local_24,"n & (n - 1) == 0u");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      if (this->arena_ == (Arena *)0x0) {
        __s = (NodeBase **)operator_new(num_elements << 3);
      }
      else {
        __s = Arena::CreateArray<google::protobuf::internal::NodeBase*>(this->arena_,num_elements);
      }
      memset(__s,0,num_elements << 3);
      return __s;
    }
    line = 0x1cd;
  }
  else {
    line = 0x1cc;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

NodeBase** CreateEmptyTable(map_index_t n) {
    ABSL_DCHECK_GE(n, kMinTableSize);
    ABSL_DCHECK_EQ(n & (n - 1), 0u);
    NodeBase** result =
        arena_ == nullptr
            ? static_cast<NodeBase**>(::operator new(n * sizeof(NodeBase*)))
            : Arena::CreateArray<NodeBase*>(arena_, n);
    memset(result, 0, n * sizeof(result[0]));
    return result;
  }